

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasLazyFields
               (FileDescriptor *file,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  long lVar2;
  MessageSCCAnalyzer *extraout_RDX;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  do {
    lVar4 = lVar4 + 1;
    if (*(int *)(file + 0x2c) <= lVar4) {
      lVar4 = -1;
      lVar3 = 0;
      do {
        lVar2 = (long)*(int *)(file + 0x3c);
        lVar4 = lVar4 + 1;
        if (lVar2 <= lVar4) {
          return lVar4 < lVar2;
        }
        bVar1 = IsLazilyVerifiedLazy((FieldDescriptor *)(lVar3 + *(long *)(file + 0x70)),options);
        lVar3 = lVar3 + 0x48;
      } while (!bVar1);
      return lVar4 < lVar2;
    }
    bVar1 = HasLazyFields((Descriptor *)(lVar3 + *(long *)(file + 0x58)),options,scc_analyzer);
    scc_analyzer = extraout_RDX;
    lVar3 = lVar3 + 0x88;
  } while (!bVar1);
  return true;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options,
                   MessageSCCAnalyzer* scc_analyzer) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options, scc_analyzer)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}